

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O3

void __thiscall chrono::ChContinuumSPH::ArchiveIN(ChContinuumSPH *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChContinuumSPH>(marchive);
  fea::ChContinuumMaterial::ArchiveIN(&this->super_ChContinuumMaterial,marchive);
  local_30 = &this->viscosity;
  local_38 = "viscosity";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->surface_tension;
  local_38 = "surface_tension";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->pressure_stiffness;
  local_38 = "pressure_stiffness";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChContinuumSPH::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChContinuumSPH>();

    // deserialize parent class
    ChContinuumMaterial::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(viscosity);
    marchive >> CHNVP(surface_tension);
    marchive >> CHNVP(pressure_stiffness);
}